

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O0

void asm_div(ASMState *as,IRIns *ir)

{
  IRCallID id;
  IRIns *ir_local;
  ASMState *as_local;
  
  if (((ir->field_1).t.irt & 0x1f) == 0xe) {
    asm_fparith(as,ir,XO_DIVSD);
  }
  else {
    id = IRCALL_lj_carith_divu64;
    if (((ir->field_1).t.irt & 0x1f) == 0x15) {
      id = IRCALL_lj_carith_divi64;
    }
    asm_callid(as,ir,id);
  }
  return;
}

Assistant:

static void asm_div(ASMState *as, IRIns *ir)
{
#if LJ_64 && LJ_HASFFI
  if (!irt_isnum(ir->t))
    asm_callid(as, ir, irt_isi64(ir->t) ? IRCALL_lj_carith_divi64 :
					  IRCALL_lj_carith_divu64);
  else
#endif
    asm_fpdiv(as, ir);
}